

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_add(m256v *A,m256v *B,m256v *out)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  uint8_t *puVar6;
  
  if (0 < A->n_row) {
    lVar4 = 0;
    do {
      if (0 < out->n_col) {
        lVar5 = 0;
        do {
          out->e[lVar5 + out->rstride * lVar4] = A->e[lVar5 + A->rstride * lVar4];
          lVar5 = lVar5 + 1;
        } while (lVar5 < out->n_col);
      }
      puVar6 = B->e + B->rstride * lVar4;
      iVar1 = B->n_col;
      if (puVar6 < puVar6 + iVar1) {
        sVar2 = out->rstride;
        puVar3 = out->e;
        lVar5 = 0;
        do {
          puVar3[lVar5 + sVar2 * lVar4] = puVar3[lVar5 + sVar2 * lVar4] ^ puVar6[lVar5];
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < A->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}